

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

ostream * masc::polygon::operator<<(ostream *os,c_ply *p)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ply_vertex *ppVar3;
  char *pcVar4;
  bool bVar5;
  undefined4 extraout_var_01;
  
  if ((p->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (p->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    c_ply::build_all(p);
  }
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)os,
                      (int)((ulong)((long)(p->all).
                                          super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(p->all).
                                         super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  bVar5 = p->type == PIN;
  pcVar4 = "out";
  if (bVar5) {
    pcVar4 = "in";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,(ulong)bVar5 ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  ppVar3 = p->head;
  do {
    iVar1 = (*ppVar3->_vptr_ply_vertex[2])(ppVar3);
    poVar2 = std::ostream::_M_insert<double>(*(double *)CONCAT44(extraout_var,iVar1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    iVar1 = (*ppVar3->_vptr_ply_vertex[2])(ppVar3);
    poVar2 = std::ostream::_M_insert<double>(*(double *)(CONCAT44(extraout_var_00,iVar1) + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    iVar1 = (*ppVar3->_vptr_ply_vertex[3])(ppVar3);
    ppVar3 = (ply_vertex *)CONCAT44(extraout_var_01,iVar1);
  } while (ppVar3 != p->head);
  iVar1 = 1;
  while( true ) {
    if ((p->all).
        super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (p->all).
        super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      c_ply::build_all(p);
    }
    if ((int)((ulong)((long)(p->all).
                            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(p->all).
                           super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar1 + -1) break;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    iVar1 = iVar1 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return os;
}

Assistant:

ostream& operator<<( ostream& os, c_ply& p)
{
    os<<p.getSize()<<" "<<((p.type==c_ply::PIN)?"in":"out")<<"\n";
    ply_vertex * ptr=p.head;
    do{
        os<<ptr->getPos()[0]<<" "<<ptr->getPos()[1]<<"\n";
        ptr=ptr->getNext();
    }while(ptr!=p.head);

    for(int i=0;i<p.getSize();i++) os<<i+1<<" ";
    os<<"\n";
    return os;
}